

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::doctypePI(AbstractDOMParser *this,XMLCh *target,XMLCh *data)

{
  bool bVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLBuffer *pXVar4;
  XMLBuffer *pXVar5;
  
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    pXVar4 = this->fInternalSubset;
    XVar3 = pXVar4->fIndex;
    XVar2 = pXVar4->fCapacity;
    pXVar5 = pXVar4;
    if (XVar3 == XVar2) {
      XMLBuffer::ensureCapacity(pXVar4,1);
      XVar3 = pXVar4->fIndex;
      pXVar5 = this->fInternalSubset;
      XVar2 = pXVar5->fCapacity;
    }
    pXVar4->fIndex = XVar3 + 1;
    pXVar4->fBuffer[XVar3] = L'<';
    XVar3 = pXVar5->fIndex;
    pXVar4 = pXVar5;
    if (XVar3 == XVar2) {
      XMLBuffer::ensureCapacity(pXVar5,1);
      XVar3 = pXVar5->fIndex;
      pXVar4 = this->fInternalSubset;
    }
    pXVar5->fIndex = XVar3 + 1;
    pXVar5->fBuffer[XVar3] = L'?';
    XMLBuffer::append(pXVar4,target);
    pXVar4 = this->fInternalSubset;
    XVar3 = pXVar4->fIndex;
    pXVar5 = pXVar4;
    if (XVar3 == pXVar4->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar4,1);
      XVar3 = pXVar4->fIndex;
      pXVar5 = this->fInternalSubset;
    }
    pXVar4->fIndex = XVar3 + 1;
    pXVar4->fBuffer[XVar3] = L' ';
    XMLBuffer::append(pXVar5,data);
    pXVar4 = this->fInternalSubset;
    XVar3 = pXVar4->fIndex;
    XVar2 = pXVar4->fCapacity;
    pXVar5 = pXVar4;
    if (XVar3 == XVar2) {
      XMLBuffer::ensureCapacity(pXVar4,1);
      XVar3 = pXVar4->fIndex;
      pXVar5 = this->fInternalSubset;
      XVar2 = pXVar5->fCapacity;
    }
    pXVar4->fIndex = XVar3 + 1;
    pXVar4->fBuffer[XVar3] = L'?';
    XVar3 = pXVar5->fIndex;
    if (XVar3 == XVar2) {
      XMLBuffer::ensureCapacity(pXVar5,1);
      XVar3 = pXVar5->fIndex;
    }
    pXVar5->fIndex = XVar3 + 1;
    pXVar5->fBuffer[XVar3] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::doctypePI
(
    const   XMLCh* const    target
    , const XMLCh* const    data
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //add these chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(target);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(data);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(chCloseAngle);
    }
}